

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  undefined4 uVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  size_t itime;
  unsigned_long uVar32;
  float fVar33;
  float fVar52;
  float fVar53;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar54;
  float fVar62;
  undefined1 auVar55 [16];
  float fVar63;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar64;
  float fVar65;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar80;
  float fVar82;
  undefined1 auVar77 [16];
  float fVar81;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vfloat4 b1_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar96;
  float fVar98;
  float fVar99;
  vfloat4 b1;
  float fVar100;
  undefined1 auVar97 [32];
  float fVar101;
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar109;
  float fVar110;
  float fVar114;
  float fVar116;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  float fVar117;
  float fVar119;
  undefined1 auVar113 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float pp;
  float fVar141;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar143 [16];
  float fVar142;
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  float fVar149;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  size_t local_3f8;
  size_t local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  anon_class_16_2_07cfa4d6 local_280;
  ulong local_270;
  undefined1 local_268 [32];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  fStack_34c = INFINITY;
  local_358._0_4_ = INFINITY;
  local_358._4_4_ = INFINITY;
  fStack_350 = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  local_378._8_4_ = 0xff800000;
  local_378._0_8_ = 0xff800000ff800000;
  local_378._12_4_ = 0xff800000;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_378;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_378;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar34._8_8_ = 0;
  auVar34._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar34._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar55._8_8_ = 0;
  auVar55._0_4_ = time_range->lower;
  auVar55._4_4_ = time_range->upper;
  auVar36 = vcmpps_avx(auVar34,auVar55,1);
  auVar35 = vinsertps_avx(auVar55,auVar34,0x50);
  auVar34 = vinsertps_avx(auVar34,auVar55,0x50);
  local_228 = vblendvps_avx(auVar34,auVar35,auVar36);
  local_218 = vmovshdup_avx(local_228);
  if (local_228._0_4_ <= local_218._0_4_) {
    uVar32 = r->_begin;
    local_3f0 = 0;
    auVar126 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar136 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_388._8_4_ = 0x7f800000;
    local_388._0_8_ = 0x7f8000007f800000;
    local_388._12_4_ = 0x7f800000;
    local_3f8 = k;
    local_368 = local_378;
    for (; uVar32 < r->_end; uVar32 = uVar32 + 1) {
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar35._8_8_ = 0;
      auVar35._0_4_ = BVar2.lower;
      auVar35._4_4_ = BVar2.upper;
      auVar36 = vmovshdup_avx(auVar35);
      auVar36 = vsubps_avx(auVar36,auVar35);
      uVar3 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar32);
      uVar24 = (ulong)uVar3;
      uVar26 = (ulong)(uVar3 + 1);
      pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar26 < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar35 = ZEXT416((uint)(fVar1 * (((float)local_218._0_4_ - BVar2.lower) / auVar36._0_4_) *
                                         0.99999976));
        auVar35 = vroundss_avx(auVar35,auVar35,10);
        auVar35 = vminss_avx(auVar35,ZEXT416((uint)fVar1));
        auVar36 = ZEXT416((uint)(fVar1 * (((float)local_228._0_4_ - BVar2.lower) / auVar36._0_4_) *
                                         1.0000002));
        auVar36 = vroundss_avx(auVar36,auVar36,9);
        auVar36 = vmaxss_avx(ZEXT816(0) << 0x40,auVar36);
        pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.normals.items;
        pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tangents.items;
        pBVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.dnormals.items;
        fVar95 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.maxRadiusScale;
        local_2d8 = (float)bezier_basis0._2788_8_;
        fStack_2d4 = SUB84(bezier_basis0._2788_8_,4);
        fStack_2d0 = (float)bezier_basis0._2796_8_;
        fStack_2cc = SUB84(bezier_basis0._2796_8_,4);
        local_2f8 = (float)bezier_basis0._3944_8_;
        fStack_2f4 = SUB84(bezier_basis0._3944_8_,4);
        fStack_2f0 = (float)bezier_basis0._3952_8_;
        fStack_2ec = SUB84(bezier_basis0._3952_8_,4);
        _fStack_240 = bezier_basis0._6264_8_;
        uVar21 = _fStack_240;
        _fStack_238 = bezier_basis0._6272_8_;
        uVar22 = _fStack_238;
        _fStack_230 = bezier_basis0._6280_8_;
        uVar23 = _fStack_230;
        lVar30 = (long)(int)auVar36._0_4_ * 0x38 + 0x10;
        uVar29 = (long)(int)auVar36._0_4_ - 1;
LAB_00bd2ffe:
        uVar29 = uVar29 + 1;
        auVar36 = auVar126._0_16_;
        auVar34 = auVar136._0_16_;
        fStack_244 = SUB84(bezier_basis0._6256_8_,4);
        fStack_314 = SUB84(bezier_basis0._8568_8_,4);
        if ((ulong)(long)(int)auVar35._0_4_ < uVar29) {
          local_280.primID = &local_270;
          fVar95 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          fVar110 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                    super_CurveGeometry.super_Geometry.time_range.upper - fVar95;
          fVar76 = ((float)local_228._0_4_ - fVar95) / fVar110;
          fVar110 = ((float)local_218._0_4_ - fVar95) / fVar110;
          _local_248 = CONCAT44(fStack_244,fVar76);
          fVar76 = fVar1 * fVar76;
          fVar95 = fVar1 * fVar110;
          auVar34 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),9);
          auVar55 = vroundss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95),10);
          auVar36 = vmaxss_avx(auVar34,ZEXT816(0));
          auVar35 = vminss_avx(auVar55,ZEXT416((uint)fVar1));
          iVar27 = (int)auVar36._0_4_;
          fVar54 = auVar35._0_4_;
          iVar25 = (int)auVar34._0_4_;
          iVar31 = -1;
          if (-1 < iVar25) {
            iVar31 = iVar25;
          }
          iVar20 = (int)fVar1 + 1;
          if ((int)auVar55._0_4_ < (int)fVar1 + 1) {
            iVar20 = (int)auVar55._0_4_;
          }
          local_268._0_4_ = iVar27;
          local_280.this = this;
          local_270 = uVar32;
          _fStack_240 = uVar21;
          _fStack_238 = uVar22;
          _fStack_230 = uVar23;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_280,(long)iVar27);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_280,(long)(int)fVar54);
          fVar76 = fVar76 - auVar36._0_4_;
          if (iVar20 - iVar31 == 1) {
            auVar36 = vmaxss_avx(ZEXT416((uint)fVar76),ZEXT816(0) << 0x40);
            auVar35 = vshufps_avx(auVar36,auVar36,0);
            auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
            auVar36 = vshufps_avx(auVar36,auVar36,0);
            auVar102._0_4_ =
                 auVar35._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar36._0_4_ * blower0.lower.field_0.m128[0];
            auVar102._4_4_ =
                 auVar35._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar36._4_4_ * blower0.lower.field_0.m128[1];
            auVar102._8_4_ =
                 auVar35._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar36._8_4_ * blower0.lower.field_0.m128[2];
            auVar102._12_4_ =
                 auVar35._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar36._12_4_ * blower0.lower.field_0.m128[3];
            auVar130._0_4_ =
                 auVar35._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar36._0_4_ * blower0.upper.field_0.m128[0];
            auVar130._4_4_ =
                 auVar35._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar36._4_4_ * blower0.upper.field_0.m128[1];
            auVar130._8_4_ =
                 auVar35._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar36._8_4_ * blower0.upper.field_0.m128[2];
            auVar130._12_4_ =
                 auVar35._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar36._12_4_ * blower0.upper.field_0.m128[3];
            auVar36 = vmaxss_avx(ZEXT416((uint)(fVar54 - fVar95)),ZEXT816(0) << 0x40);
            auVar35 = vshufps_avx(auVar36,auVar36,0);
            auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
            auVar36 = vshufps_avx(auVar36,auVar36,0);
            auVar68._0_4_ =
                 auVar36._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar35._0_4_ * blower0.lower.field_0.m128[0];
            auVar68._4_4_ =
                 auVar36._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar35._4_4_ * blower0.lower.field_0.m128[1];
            auVar68._8_4_ =
                 auVar36._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar35._8_4_ * blower0.lower.field_0.m128[2];
            auVar68._12_4_ =
                 auVar36._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar35._12_4_ * blower0.lower.field_0.m128[3];
            auVar79._0_4_ =
                 auVar36._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar35._0_4_ * blower0.upper.field_0.m128[0];
            auVar79._4_4_ =
                 auVar36._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar35._4_4_ * blower0.upper.field_0.m128[1];
            auVar79._8_4_ =
                 auVar36._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar35._8_4_ * blower0.upper.field_0.m128[2];
            auVar79._12_4_ =
                 auVar36._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar35._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_280,(long)(local_268._0_4_ + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_280,(long)((int)fVar54 + -1));
            auVar36 = vmaxss_avx(ZEXT416((uint)fVar76),ZEXT816(0) << 0x40);
            auVar35 = vshufps_avx(auVar36,auVar36,0);
            auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
            auVar36 = vshufps_avx(auVar36,auVar36,0);
            auVar102._0_4_ =
                 auVar35._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar36._0_4_ * blower0.lower.field_0.m128[0];
            auVar102._4_4_ =
                 auVar35._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar36._4_4_ * blower0.lower.field_0.m128[1];
            auVar102._8_4_ =
                 auVar35._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar36._8_4_ * blower0.lower.field_0.m128[2];
            auVar102._12_4_ =
                 auVar35._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar36._12_4_ * blower0.lower.field_0.m128[3];
            auVar130._0_4_ =
                 auVar35._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar36._0_4_ * blower0.upper.field_0.m128[0];
            auVar130._4_4_ =
                 auVar35._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar36._4_4_ * blower0.upper.field_0.m128[1];
            auVar130._8_4_ =
                 auVar35._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar36._8_4_ * blower0.upper.field_0.m128[2];
            auVar130._12_4_ =
                 auVar35._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar36._12_4_ * blower0.upper.field_0.m128[3];
            auVar36 = vmaxss_avx(ZEXT416((uint)(fVar54 - fVar95)),ZEXT816(0) << 0x40);
            auVar35 = vshufps_avx(auVar36,auVar36,0);
            auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
            auVar36 = vshufps_avx(auVar36,auVar36,0);
            auVar68._0_4_ =
                 auVar35._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar36._0_4_ * bupper1.lower.field_0.m128[0];
            auVar68._4_4_ =
                 auVar35._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar36._4_4_ * bupper1.lower.field_0.m128[1];
            auVar68._8_4_ =
                 auVar35._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar36._8_4_ * bupper1.lower.field_0.m128[2];
            auVar68._12_4_ =
                 auVar35._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar36._12_4_ * bupper1.lower.field_0.m128[3];
            auVar79._0_4_ =
                 auVar35._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar36._0_4_ * bupper1.upper.field_0.m128[0];
            auVar79._4_4_ =
                 auVar35._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar36._4_4_ * bupper1.upper.field_0.m128[1];
            auVar79._8_4_ =
                 auVar35._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar36._8_4_ * bupper1.upper.field_0.m128[2];
            auVar79._12_4_ =
                 auVar35._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar36._12_4_ * bupper1.upper.field_0.m128[3];
            if (iVar25 < 0) {
              iVar25 = -1;
            }
            fVar110 = fVar110 - local_248;
            itime = (size_t)iVar25;
            while (itime = itime + 1, (long)itime < (long)iVar20) {
              auVar45._0_4_ = ((float)(int)itime / fVar1 - local_248) / fVar110;
              auVar45._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar36 = vshufps_avx(auVar45,auVar45,0);
              local_3e8 = auVar68._0_4_;
              fStack_3e4 = auVar68._4_4_;
              fStack_3e0 = auVar68._8_4_;
              fStack_3dc = auVar68._12_4_;
              auVar35 = vshufps_avx(ZEXT416((uint)(1.0 - auVar45._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar45._0_4_)),0);
              fVar115 = auVar102._4_4_;
              fVar117 = auVar102._8_4_;
              fVar53 = auVar102._12_4_;
              fVar95 = auVar79._4_4_;
              fVar76 = auVar79._8_4_;
              fVar54 = auVar79._12_4_;
              fVar119 = auVar130._4_4_;
              fVar65 = auVar130._8_4_;
              fVar62 = auVar130._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_280,itime);
              auVar144._4_4_ = auVar36._4_4_ * fStack_3e4 + fVar115 * auVar35._4_4_;
              auVar144._0_4_ = auVar36._0_4_ * local_3e8 + auVar102._0_4_ * auVar35._0_4_;
              auVar144._8_4_ = auVar36._8_4_ * fStack_3e0 + fVar117 * auVar35._8_4_;
              auVar144._12_4_ = auVar36._12_4_ * fStack_3dc + fVar53 * auVar35._12_4_;
              auVar34 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar144);
              auVar10._4_4_ = fVar95 * auVar36._4_4_ + fVar119 * auVar35._4_4_;
              auVar10._0_4_ = auVar79._0_4_ * auVar36._0_4_ + auVar130._0_4_ * auVar35._0_4_;
              auVar10._8_4_ = fVar76 * auVar36._8_4_ + fVar65 * auVar35._8_4_;
              auVar10._12_4_ = fVar54 * auVar36._12_4_ + fVar62 * auVar35._12_4_;
              auVar36 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar10);
              auVar35 = vminps_avx(auVar34,ZEXT816(0) << 0x40);
              auVar36 = vmaxps_avx(auVar36,ZEXT816(0) << 0x40);
              auVar102._0_4_ = auVar102._0_4_ + auVar35._0_4_;
              auVar102._4_4_ = fVar115 + auVar35._4_4_;
              auVar102._8_4_ = fVar117 + auVar35._8_4_;
              auVar102._12_4_ = fVar53 + auVar35._12_4_;
              auVar68._0_4_ = local_3e8 + auVar35._0_4_;
              auVar68._4_4_ = fStack_3e4 + auVar35._4_4_;
              auVar68._8_4_ = fStack_3e0 + auVar35._8_4_;
              auVar68._12_4_ = fStack_3dc + auVar35._12_4_;
              auVar130._0_4_ = auVar130._0_4_ + auVar36._0_4_;
              auVar130._4_4_ = fVar119 + auVar36._4_4_;
              auVar130._8_4_ = fVar65 + auVar36._8_4_;
              auVar130._12_4_ = fVar62 + auVar36._12_4_;
              auVar79._0_4_ = auVar79._0_4_ + auVar36._0_4_;
              auVar79._4_4_ = fVar95 + auVar36._4_4_;
              auVar79._8_4_ = fVar76 + auVar36._8_4_;
              auVar79._12_4_ = fVar54 + auVar36._12_4_;
            }
          }
          auVar36 = vcmpps_avx(auVar102,auVar130,2);
          uVar28 = vmovmskps_avx(auVar36);
          auVar126 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar136 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if ((~(byte)uVar28 & 7) == 0) {
            auVar36 = vcmpps_avx(auVar68,auVar79,2);
            uVar28 = vmovmskps_avx(auVar36);
            if ((~(byte)uVar28 & 7) == 0) {
              auVar36 = vminps_avx(auVar102,auVar68);
              aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar36,ZEXT416(geomID),0x30);
              auVar36 = vmaxps_avx(auVar130,auVar79);
              aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar36,ZEXT416((uint)uVar32),0x30);
              auVar36._0_4_ = aVar12.x + aVar13.x;
              auVar36._4_4_ = aVar12.y + aVar13.y;
              auVar36._8_4_ = aVar12.z + aVar13.z;
              auVar36._12_4_ = aVar12.field_3.w + aVar13.field_3.w;
              local_388 = vminps_avx(local_388,(undefined1  [16])aVar12);
              local_378 = vmaxps_avx(local_378,(undefined1  [16])aVar13);
              _local_358 = vminps_avx(_local_358,auVar36);
              local_368 = vmaxps_avx(local_368,auVar36);
              local_3f0 = local_3f0 + 1;
              prims[local_3f8].lower.field_0.field_1 = aVar12;
              prims[local_3f8].upper.field_0.field_1 = aVar13;
              local_3f8 = local_3f8 + 1;
            }
          }
        }
        else {
          lVar8 = *(long *)((long)pBVar4 + lVar30 + -0x10);
          lVar9 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar30);
          auVar55 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar24);
          auVar68 = vcmpps_avx(auVar55,auVar36,2);
          auVar79 = vcmpps_avx(auVar55,auVar34,5);
          auVar68 = vorps_avx(auVar68,auVar79);
          if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar68[0xf]) {
            auVar68 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar26);
            auVar79 = vcmpps_avx(auVar68,auVar36,2);
            auVar102 = vcmpps_avx(auVar68,auVar34,5);
            auVar79 = vorps_avx(auVar79,auVar102);
            if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar79[0xf]) {
              lVar8 = *(long *)((long)pBVar6 + lVar30 + -0x10);
              lVar9 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar30);
              auVar79 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar24);
              auVar102 = vcmpps_avx(auVar79,auVar36,2);
              auVar130 = vcmpps_avx(auVar79,auVar34,5);
              auVar102 = vorps_avx(auVar102,auVar130);
              if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar102 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar102 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar102[0xf]) {
                auVar102 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar26);
                auVar130 = vcmpps_avx(auVar102,auVar36,2);
                auVar10 = vcmpps_avx(auVar102,auVar34,5);
                auVar130 = vorps_avx(auVar130,auVar10);
                if ((((auVar130 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar130 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar130 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar130[0xf]) {
                  lVar8 = *(long *)((long)pBVar5 + lVar30 + -0x10);
                  lVar9 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar30);
                  auVar130 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar24);
                  auVar10 = vcmpps_avx(auVar130,auVar36,6);
                  auVar144 = vcmpps_avx(auVar130,auVar34,1);
                  auVar10 = vandps_avx(auVar10,auVar144);
                  uVar28 = vmovmskps_avx(auVar10);
                  if ((~(byte)uVar28 & 7) == 0) {
                    auVar10 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar26);
                    auVar144 = vcmpps_avx(auVar10,auVar36,6);
                    auVar45 = vcmpps_avx(auVar10,auVar34,1);
                    auVar144 = vandps_avx(auVar144,auVar45);
                    uVar28 = vmovmskps_avx(auVar144);
                    if ((~(byte)uVar28 & 7) == 0) {
                      lVar8 = *(long *)((long)pBVar7 + lVar30 + -0x10);
                      lVar9 = *(long *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar30);
                      auVar144 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar24);
                      auVar45 = vcmpps_avx(auVar144,auVar36,6);
                      auVar11 = vcmpps_avx(auVar144,auVar34,1);
                      auVar45 = vandps_avx(auVar45,auVar11);
                      uVar28 = vmovmskps_avx(auVar45);
                      if ((~(byte)uVar28 & 7) == 0) {
                        auVar45 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar26);
                        auVar36 = vcmpps_avx(auVar45,auVar36,6);
                        auVar34 = vcmpps_avx(auVar45,auVar34,1);
                        auVar36 = vandps_avx(auVar36,auVar34);
                        uVar28 = vmovmskps_avx(auVar36);
                        if ((~(byte)uVar28 & 7) == 0) goto code_r0x00bd3176;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00bd3d86:
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_388._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_388._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_378._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_378._8_8_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
    .m128[0] = (float)local_358._0_4_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
    .m128[1] = (float)local_358._4_4_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
    .m128[2] = fStack_350;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
    .m128[3] = fStack_34c;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_368._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_368._8_8_;
    __return_storage_ptr__->end = local_3f0;
  }
  return __return_storage_ptr__;
code_r0x00bd3176:
  auVar36 = vshufps_avx(auVar55,auVar55,0xff);
  auVar36 = vinsertps_avx(auVar55,ZEXT416((uint)(auVar36._0_4_ * fVar95)),0x30);
  auVar34 = vshufps_avx(auVar79,auVar79,0xff);
  auVar34 = vinsertps_avx(auVar79,ZEXT416((uint)(auVar34._0_4_ * fVar95)),0x30);
  fVar64 = auVar36._0_4_;
  fVar141 = fVar64 + auVar34._0_4_ * 0.33333334;
  fVar71 = auVar36._4_4_;
  fVar146 = fVar71 + auVar34._4_4_ * 0.33333334;
  fVar72 = auVar36._8_4_;
  fVar147 = fVar72 + auVar34._8_4_ * 0.33333334;
  fVar73 = auVar36._12_4_;
  fVar148 = fVar73 + auVar34._12_4_ * 0.33333334;
  auVar36 = vshufps_avx(auVar68,auVar68,0xff);
  auVar36 = vinsertps_avx(auVar68,ZEXT416((uint)(auVar36._0_4_ * fVar95)),0x30);
  fVar76 = auVar36._0_4_;
  fVar115 = auVar36._4_4_;
  fVar119 = auVar36._8_4_;
  fVar33 = auVar36._12_4_;
  auVar34 = vshufps_avx(auVar102,auVar102,0xff);
  auVar34 = vinsertps_avx(auVar102,ZEXT416((uint)(auVar34._0_4_ * fVar95)),0x30);
  auVar77._0_4_ = auVar34._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar34._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar34._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar34._12_4_ * 0.33333334;
  auVar102 = vsubps_avx(auVar36,auVar77);
  fVar74 = auVar102._0_4_ * 0.0;
  fVar80 = auVar102._4_4_ * 0.0;
  fVar82 = auVar102._8_4_ * 0.0;
  fVar84 = auVar102._12_4_ * 0.0;
  fVar96 = fVar76 * 0.0 + fVar74;
  fVar98 = fVar115 * 0.0 + fVar80;
  fVar99 = fVar119 * 0.0 + fVar82;
  fVar100 = fVar33 * 0.0 + fVar84;
  fVar54 = auVar130._0_4_;
  fVar137 = fVar54 + auVar144._0_4_ * 0.33333334;
  fVar53 = auVar130._4_4_;
  fVar138 = fVar53 + auVar144._4_4_ * 0.33333334;
  fVar62 = auVar130._8_4_;
  fVar139 = fVar62 + auVar144._8_4_ * 0.33333334;
  fVar63 = auVar130._12_4_;
  fVar140 = fVar63 + auVar144._12_4_ * 0.33333334;
  fVar75 = fVar137 * 0.0;
  fVar81 = fVar138 * 0.0;
  fVar83 = fVar139 * 0.0;
  fVar85 = fVar140 * 0.0;
  fVar109 = auVar10._0_4_;
  fVar114 = auVar10._4_4_;
  fVar116 = auVar10._8_4_;
  fVar118 = auVar10._12_4_;
  auVar86._0_4_ = auVar45._0_4_ * 0.33333334;
  auVar86._4_4_ = auVar45._4_4_ * 0.33333334;
  auVar86._8_4_ = auVar45._8_4_ * 0.33333334;
  auVar86._12_4_ = auVar45._12_4_ * 0.33333334;
  auVar130 = vsubps_avx(auVar10,auVar86);
  fVar101 = auVar130._0_4_ * 0.0;
  fVar106 = auVar130._4_4_ * 0.0;
  fVar107 = auVar130._8_4_ * 0.0;
  fVar108 = auVar130._12_4_ * 0.0;
  fVar149 = fVar109 * 0.0 + fVar101;
  fVar152 = fVar114 * 0.0 + fVar106;
  fVar153 = fVar116 * 0.0 + fVar107;
  fVar154 = fVar118 * 0.0 + fVar108;
  auVar87._0_4_ = fVar54 + fVar149 + fVar75;
  auVar87._4_4_ = fVar53 + fVar152 + fVar81;
  auVar87._8_4_ = fVar62 + fVar153 + fVar83;
  auVar87._12_4_ = fVar63 + fVar154 + fVar85;
  auVar37._0_4_ = fVar141 * 3.0 + fVar96;
  auVar37._4_4_ = fVar146 * 3.0 + fVar98;
  auVar37._8_4_ = fVar147 * 3.0 + fVar99;
  auVar37._12_4_ = fVar148 * 3.0 + fVar100;
  auVar127._0_4_ = fVar64 * 3.0;
  auVar127._4_4_ = fVar71 * 3.0;
  auVar127._8_4_ = fVar72 * 3.0;
  auVar127._12_4_ = fVar73 * 3.0;
  auVar10 = vsubps_avx(auVar37,auVar127);
  auVar55 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar143._0_4_ = auVar87._0_4_ * auVar55._0_4_;
  auVar143._4_4_ = auVar87._4_4_ * auVar55._4_4_;
  auVar143._8_4_ = auVar87._8_4_ * auVar55._8_4_;
  auVar143._12_4_ = auVar87._12_4_ * auVar55._12_4_;
  auVar36 = vshufps_avx(auVar87,auVar87,0xc9);
  fVar110 = auVar10._0_4_;
  auVar88._0_4_ = auVar36._0_4_ * fVar110;
  fVar117 = auVar10._4_4_;
  auVar88._4_4_ = auVar36._4_4_ * fVar117;
  fVar65 = auVar10._8_4_;
  auVar88._8_4_ = auVar36._8_4_ * fVar65;
  fVar52 = auVar10._12_4_;
  auVar88._12_4_ = auVar36._12_4_ * fVar52;
  auVar36 = vsubps_avx(auVar143,auVar88);
  auVar68 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar68,auVar68,0x7f);
  fVar142 = auVar36._0_4_;
  auVar79 = ZEXT416((uint)fVar142);
  auVar34 = vrsqrtss_avx(auVar79,auVar79);
  fVar155 = auVar34._0_4_;
  auVar34 = vrcpss_avx(auVar79,auVar79);
  auVar120._0_4_ = fVar137 * 3.0 + fVar149;
  auVar120._4_4_ = fVar138 * 3.0 + fVar152;
  auVar120._8_4_ = fVar139 * 3.0 + fVar153;
  auVar120._12_4_ = fVar140 * 3.0 + fVar154;
  auVar128._0_4_ = fVar54 * 3.0;
  auVar128._4_4_ = fVar53 * 3.0;
  auVar128._8_4_ = fVar62 * 3.0;
  auVar128._12_4_ = fVar63 * 3.0;
  auVar79 = vsubps_avx(auVar120,auVar128);
  auVar38._0_4_ = auVar79._0_4_ * auVar55._0_4_;
  auVar38._4_4_ = auVar79._4_4_ * auVar55._4_4_;
  auVar38._8_4_ = auVar79._8_4_ * auVar55._8_4_;
  auVar38._12_4_ = auVar79._12_4_ * auVar55._12_4_;
  auVar55 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar121._0_4_ = auVar55._0_4_ * fVar110;
  auVar121._4_4_ = auVar55._4_4_ * fVar117;
  auVar121._8_4_ = auVar55._8_4_ * fVar65;
  auVar121._12_4_ = auVar55._12_4_ * fVar52;
  auVar79 = vsubps_avx(auVar38,auVar121);
  auVar55 = vshufps_avx(auVar36,auVar36,0);
  auVar79 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar36 = vdpps_avx(auVar68,auVar79,0x7f);
  auVar39._0_4_ = auVar55._0_4_ * auVar79._0_4_;
  auVar39._4_4_ = auVar55._4_4_ * auVar79._4_4_;
  auVar39._8_4_ = auVar55._8_4_ * auVar79._8_4_;
  auVar39._12_4_ = auVar55._12_4_ * auVar79._12_4_;
  auVar36 = vshufps_avx(auVar36,auVar36,0);
  auVar122._0_4_ = auVar36._0_4_ * auVar68._0_4_;
  auVar122._4_4_ = auVar36._4_4_ * auVar68._4_4_;
  auVar122._8_4_ = auVar36._8_4_ * auVar68._8_4_;
  auVar122._12_4_ = auVar36._12_4_ * auVar68._12_4_;
  auVar79 = vsubps_avx(auVar39,auVar122);
  fVar141 = fVar141 * 0.0;
  fVar146 = fVar146 * 0.0;
  fVar147 = fVar147 * 0.0;
  fVar148 = fVar148 * 0.0;
  auVar129._0_4_ = fVar64 + fVar141 + fVar96;
  auVar129._4_4_ = fVar71 + fVar146 + fVar98;
  auVar129._8_4_ = fVar72 + fVar147 + fVar99;
  auVar129._12_4_ = fVar73 + fVar148 + fVar100;
  auVar36 = ZEXT416((uint)((2.0 - fVar142 * auVar34._0_4_) * auVar34._0_4_));
  auVar36 = vshufps_avx(auVar36,auVar36,0);
  auVar34 = vshufps_avx(auVar129,auVar129,0xff);
  auVar55 = ZEXT416((uint)(fVar155 * 1.5 - fVar142 * 0.5 * fVar155 * fVar155 * fVar155));
  auVar55 = vshufps_avx(auVar55,auVar55,0);
  fVar96 = auVar55._0_4_ * auVar68._0_4_;
  fVar98 = auVar55._4_4_ * auVar68._4_4_;
  fVar99 = auVar55._8_4_ * auVar68._8_4_;
  fVar100 = auVar55._12_4_ * auVar68._12_4_;
  auVar68 = vshufps_avx(auVar10,auVar10,0xff);
  local_f8._0_4_ = auVar34._0_4_ * fVar96;
  local_f8._4_4_ = auVar34._4_4_ * fVar98;
  fStack_f0 = auVar34._8_4_ * fVar99;
  fStack_ec = auVar34._12_4_ * fVar100;
  local_338._0_4_ =
       auVar68._0_4_ * fVar96 + auVar34._0_4_ * auVar55._0_4_ * auVar79._0_4_ * auVar36._0_4_;
  local_338._4_4_ =
       auVar68._4_4_ * fVar98 + auVar34._4_4_ * auVar55._4_4_ * auVar79._4_4_ * auVar36._4_4_;
  fStack_330 = auVar68._8_4_ * fVar99 +
               auVar34._8_4_ * auVar55._8_4_ * auVar79._8_4_ * auVar36._8_4_;
  fStack_32c = auVar68._12_4_ * fVar100 +
               auVar34._12_4_ * auVar55._12_4_ * auVar79._12_4_ * auVar36._12_4_;
  auVar78._0_4_ = fVar64 * 0.0;
  auVar78._4_4_ = fVar71 * 0.0;
  auVar78._8_4_ = fVar72 * 0.0;
  auVar78._12_4_ = fVar73 * 0.0;
  auVar134._0_4_ = fVar54 * 0.0;
  auVar134._4_4_ = fVar53 * 0.0;
  auVar134._8_4_ = fVar62 * 0.0;
  auVar134._12_4_ = fVar63 * 0.0;
  auVar56._0_4_ = auVar134._0_4_ + fVar75 + fVar109 + fVar101;
  auVar56._4_4_ = auVar134._4_4_ + fVar81 + fVar114 + fVar106;
  auVar56._8_4_ = auVar134._8_4_ + fVar83 + fVar116 + fVar107;
  auVar56._12_4_ = auVar134._12_4_ + fVar85 + fVar118 + fVar108;
  auVar89._0_4_ = fVar76 * 3.0;
  auVar89._4_4_ = fVar115 * 3.0;
  auVar89._8_4_ = fVar119 * 3.0;
  auVar89._12_4_ = fVar33 * 3.0;
  auVar90._0_4_ = auVar102._0_4_ * 3.0;
  auVar90._4_4_ = auVar102._4_4_ * 3.0;
  auVar90._8_4_ = auVar102._8_4_ * 3.0;
  auVar90._12_4_ = auVar102._12_4_ * 3.0;
  auVar36 = vsubps_avx(auVar89,auVar90);
  auVar40._0_4_ = fVar141 + auVar36._0_4_;
  auVar40._4_4_ = fVar146 + auVar36._4_4_;
  auVar40._8_4_ = fVar147 + auVar36._8_4_;
  auVar40._12_4_ = fVar148 + auVar36._12_4_;
  auVar102 = vsubps_avx(auVar40,auVar78);
  auVar55 = vshufps_avx(auVar102,auVar102,0xc9);
  auVar91._0_4_ = auVar56._0_4_ * auVar55._0_4_;
  auVar91._4_4_ = auVar56._4_4_ * auVar55._4_4_;
  auVar91._8_4_ = auVar56._8_4_ * auVar55._8_4_;
  auVar91._12_4_ = auVar56._12_4_ * auVar55._12_4_;
  auVar36 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar54 = auVar102._0_4_;
  auVar57._0_4_ = auVar36._0_4_ * fVar54;
  fVar53 = auVar102._4_4_;
  auVar57._4_4_ = auVar36._4_4_ * fVar53;
  fVar62 = auVar102._8_4_;
  auVar57._8_4_ = auVar36._8_4_ * fVar62;
  fVar63 = auVar102._12_4_;
  auVar57._12_4_ = auVar36._12_4_ * fVar63;
  auVar36 = vsubps_avx(auVar91,auVar57);
  auVar68 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar68,auVar68,0x7f);
  auVar156._0_4_ = fVar141 + fVar76 + fVar74 + auVar78._0_4_;
  auVar156._4_4_ = fVar146 + fVar115 + fVar80 + auVar78._4_4_;
  auVar156._8_4_ = fVar147 + fVar119 + fVar82 + auVar78._8_4_;
  auVar156._12_4_ = fVar148 + fVar33 + fVar84 + auVar78._12_4_;
  fVar76 = auVar36._0_4_;
  auVar144 = ZEXT416((uint)fVar76);
  auVar34 = vrsqrtss_avx(auVar144,auVar144);
  fVar115 = auVar34._0_4_;
  auVar150._0_4_ = auVar129._0_4_ + (float)local_f8._0_4_;
  auVar150._4_4_ = auVar129._4_4_ + (float)local_f8._4_4_;
  auVar150._8_4_ = auVar129._8_4_ + fStack_f0;
  auVar150._12_4_ = auVar129._12_4_ + fStack_ec;
  auVar111._0_4_ = fVar109 * 3.0;
  auVar111._4_4_ = fVar114 * 3.0;
  auVar111._8_4_ = fVar116 * 3.0;
  auVar111._12_4_ = fVar118 * 3.0;
  auVar123._0_4_ = auVar130._0_4_ * 3.0;
  auVar123._4_4_ = auVar130._4_4_ * 3.0;
  auVar123._8_4_ = auVar130._8_4_ * 3.0;
  auVar123._12_4_ = auVar130._12_4_ * 3.0;
  auVar34 = vsubps_avx(auVar111,auVar123);
  auVar124._0_4_ = auVar150._0_4_ + ((float)local_338._0_4_ + fVar110) * 0.33333334;
  auVar124._4_4_ = auVar150._4_4_ + ((float)local_338._4_4_ + fVar117) * 0.33333334;
  auVar124._8_4_ = auVar150._8_4_ + (fStack_330 + fVar65) * 0.33333334;
  auVar124._12_4_ = auVar150._12_4_ + (fStack_32c + fVar52) * 0.33333334;
  auVar112._0_4_ = auVar34._0_4_ + fVar75;
  auVar112._4_4_ = auVar34._4_4_ + fVar81;
  auVar112._8_4_ = auVar34._8_4_ + fVar83;
  auVar112._12_4_ = auVar34._12_4_ + fVar85;
  auVar34 = vshufps_avx(auVar156,auVar156,0xff);
  auVar79 = ZEXT416((uint)(fVar115 * 1.5 - fVar115 * fVar115 * fVar76 * 0.5 * fVar115));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar130 = vsubps_avx(auVar112,auVar134);
  fVar110 = auVar68._0_4_ * auVar79._0_4_;
  fVar115 = auVar68._4_4_ * auVar79._4_4_;
  fVar117 = auVar68._8_4_ * auVar79._8_4_;
  fVar119 = auVar68._12_4_ * auVar79._12_4_;
  auVar41._0_4_ = auVar130._0_4_ * auVar55._0_4_;
  auVar41._4_4_ = auVar130._4_4_ * auVar55._4_4_;
  auVar41._8_4_ = auVar130._8_4_ * auVar55._8_4_;
  auVar41._12_4_ = auVar130._12_4_ * auVar55._12_4_;
  auVar55 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar66._0_4_ = auVar55._0_4_ * fVar54;
  auVar66._4_4_ = auVar55._4_4_ * fVar53;
  auVar66._8_4_ = auVar55._8_4_ * fVar62;
  auVar66._12_4_ = auVar55._12_4_ * fVar63;
  auVar55 = vsubps_avx(auVar41,auVar66);
  auVar36 = vshufps_avx(auVar36,auVar36,0);
  auVar55 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar67._0_4_ = auVar36._0_4_ * auVar55._0_4_;
  auVar67._4_4_ = auVar36._4_4_ * auVar55._4_4_;
  auVar67._8_4_ = auVar36._8_4_ * auVar55._8_4_;
  auVar67._12_4_ = auVar36._12_4_ * auVar55._12_4_;
  auVar36 = vdpps_avx(auVar68,auVar55,0x7f);
  auVar36 = vshufps_avx(auVar36,auVar36,0);
  auVar42._0_4_ = auVar36._0_4_ * auVar68._0_4_;
  auVar42._4_4_ = auVar36._4_4_ * auVar68._4_4_;
  auVar42._8_4_ = auVar36._8_4_ * auVar68._8_4_;
  auVar42._12_4_ = auVar36._12_4_ * auVar68._12_4_;
  auVar55 = vshufps_avx(auVar102,auVar102,0xff);
  local_348._0_4_ = auVar34._0_4_ * fVar110;
  local_348._4_4_ = auVar34._4_4_ * fVar115;
  fStack_340 = auVar34._8_4_ * fVar117;
  fStack_33c = auVar34._12_4_ * fVar119;
  auVar68 = vsubps_avx(auVar67,auVar42);
  auVar157._0_4_ = auVar156._0_4_ + (float)local_348._0_4_;
  auVar157._4_4_ = auVar156._4_4_ + (float)local_348._4_4_;
  auVar157._8_4_ = auVar156._8_4_ + fStack_340;
  auVar157._12_4_ = auVar156._12_4_ + fStack_33c;
  auVar36 = vrcpss_avx(auVar144,auVar144);
  auVar36 = ZEXT416((uint)(auVar36._0_4_ * (2.0 - fVar76 * auVar36._0_4_)));
  auVar36 = vshufps_avx(auVar36,auVar36,0);
  fVar33 = fVar110 * auVar55._0_4_ + auVar34._0_4_ * auVar79._0_4_ * auVar68._0_4_ * auVar36._0_4_;
  fVar52 = fVar115 * auVar55._4_4_ + auVar34._4_4_ * auVar79._4_4_ * auVar68._4_4_ * auVar36._4_4_;
  fVar141 = fVar117 * auVar55._8_4_ + auVar34._8_4_ * auVar79._8_4_ * auVar68._8_4_ * auVar36._8_4_;
  fVar146 = fVar119 * auVar55._12_4_ +
            auVar34._12_4_ * auVar79._12_4_ * auVar68._12_4_ * auVar36._12_4_;
  auVar43._0_4_ = (fVar54 + fVar33) * 0.33333334;
  auVar43._4_4_ = (fVar53 + fVar52) * 0.33333334;
  auVar43._8_4_ = (fVar62 + fVar141) * 0.33333334;
  auVar43._12_4_ = (fVar63 + fVar146) * 0.33333334;
  auVar55 = vsubps_avx(auVar157,auVar43);
  auVar36 = vshufps_avx(auVar55,auVar55,0xaa);
  fStack_2c8 = (float)bezier_basis0._2804_8_;
  fStack_2c4 = SUB84(bezier_basis0._2804_8_,4);
  fStack_2c0 = (float)bezier_basis0._2812_8_;
  fStack_2bc = SUB84(bezier_basis0._2812_8_,4);
  fVar115 = auVar36._0_4_;
  fVar117 = auVar36._4_4_;
  fVar53 = auVar36._8_4_;
  fVar119 = auVar36._12_4_;
  auVar36 = vshufps_avx(auVar157,auVar157,0xaa);
  fStack_2e8 = (float)bezier_basis0._3960_8_;
  fStack_2e4 = SUB84(bezier_basis0._3960_8_,4);
  fStack_2e0 = (float)bezier_basis0._3968_8_;
  fStack_2dc = SUB84(bezier_basis0._3968_8_,4);
  fVar65 = auVar36._0_4_;
  fVar62 = auVar36._4_4_;
  fVar63 = auVar36._8_4_;
  fVar147 = auVar36._12_4_;
  auVar36 = vshufps_avx(auVar124,auVar124,0xaa);
  local_2b8 = (float)bezier_basis0._1632_8_;
  fStack_2b4 = SUB84(bezier_basis0._1632_8_,4);
  fStack_2b0 = (float)bezier_basis0._1640_8_;
  fStack_2ac = SUB84(bezier_basis0._1640_8_,4);
  fStack_2a8 = (float)bezier_basis0._1648_8_;
  fStack_2a4 = SUB84(bezier_basis0._1648_8_,4);
  fStack_2a0 = (float)bezier_basis0._1656_8_;
  fVar148 = auVar36._0_4_;
  fVar64 = auVar36._4_4_;
  fVar71 = auVar36._8_4_;
  auVar34 = vshufps_avx(auVar150,auVar150,0xaa);
  local_3c8 = (float)bezier_basis0._476_8_;
  fStack_3c4 = SUB84(bezier_basis0._476_8_,4);
  fStack_3c0 = (float)bezier_basis0._484_8_;
  fStack_3bc = SUB84(bezier_basis0._484_8_,4);
  fStack_3b8 = (float)bezier_basis0._492_8_;
  fStack_3b4 = SUB84(bezier_basis0._492_8_,4);
  fStack_3b0 = (float)bezier_basis0._500_8_;
  fVar76 = auVar34._0_4_;
  fVar110 = auVar34._4_4_;
  fVar54 = auVar34._8_4_;
  auVar92._0_4_ =
       local_3c8 * fVar76 + fVar148 * local_2b8 + fVar115 * local_2d8 + fVar65 * local_2f8;
  auVar92._4_4_ =
       fStack_3c4 * fVar110 + fVar64 * fStack_2b4 + fVar117 * fStack_2d4 + fVar62 * fStack_2f4;
  auVar92._8_4_ =
       fStack_3c0 * fVar54 + fVar71 * fStack_2b0 + fVar53 * fStack_2d0 + fVar63 * fStack_2f0;
  auVar92._12_4_ =
       fStack_3bc * auVar34._12_4_ +
       auVar36._12_4_ * fStack_2ac + fVar119 * fStack_2cc + fVar147 * fStack_2ec;
  auVar92._16_4_ =
       fStack_3b8 * fVar76 + fVar148 * fStack_2a8 + fVar115 * fStack_2c8 + fVar65 * fStack_2e8;
  auVar92._20_4_ =
       fStack_3b4 * fVar110 + fVar64 * fStack_2a4 + fVar117 * fStack_2c4 + fVar62 * fStack_2e4;
  auVar92._24_4_ =
       fStack_3b0 * fVar54 + fVar71 * fStack_2a0 + fVar53 * fStack_2c0 + fVar63 * fStack_2e0;
  auVar92._28_4_ = 0;
  local_3a8 = (float)bezier_basis0._7412_8_;
  fStack_3a4 = SUB84(bezier_basis0._7412_8_,4);
  fStack_3a0 = (float)bezier_basis0._7420_8_;
  fStack_39c = SUB84(bezier_basis0._7420_8_,4);
  fStack_398 = (float)bezier_basis0._7428_8_;
  fStack_394 = SUB84(bezier_basis0._7428_8_,4);
  fStack_390 = (float)bezier_basis0._7436_8_;
  local_318 = (float)bezier_basis0._8568_8_;
  fStack_310 = (float)bezier_basis0._8576_8_;
  fStack_30c = SUB84(bezier_basis0._8576_8_,4);
  fStack_308 = (float)bezier_basis0._8584_8_;
  fStack_304 = SUB84(bezier_basis0._8584_8_,4);
  fStack_300 = (float)bezier_basis0._8592_8_;
  local_248 = (float)bezier_basis0._6256_8_;
  fStack_240 = (float)bezier_basis0._6264_8_;
  fStack_23c = SUB84(bezier_basis0._6264_8_,4);
  fStack_238 = (float)bezier_basis0._6272_8_;
  fStack_234 = SUB84(bezier_basis0._6272_8_,4);
  fStack_230 = (float)bezier_basis0._6280_8_;
  auVar59._8_4_ = 0xff800000;
  auVar59._0_8_ = 0xff800000ff800000;
  auVar59._12_4_ = 0xff800000;
  auVar59._16_4_ = 0xff800000;
  auVar59._20_4_ = 0xff800000;
  auVar59._24_4_ = 0xff800000;
  auVar59._28_4_ = 0xff800000;
  auVar59 = vmaxps_avx(auVar59,auVar92);
  local_3e8 = (float)bezier_basis0._5100_8_;
  fStack_3e4 = SUB84(bezier_basis0._5100_8_,4);
  fStack_3e0 = (float)bezier_basis0._5108_8_;
  fStack_3dc = SUB84(bezier_basis0._5108_8_,4);
  fStack_3d8 = (float)bezier_basis0._5116_8_;
  fStack_3d4 = SUB84(bezier_basis0._5116_8_,4);
  fStack_3d0 = (float)bezier_basis0._5124_8_;
  auVar46._0_4_ =
       fVar76 * local_3e8 + fVar148 * local_248 + fVar115 * local_3a8 + fVar65 * local_318;
  auVar46._4_4_ =
       fVar110 * fStack_3e4 + fVar64 * fStack_244 + fVar117 * fStack_3a4 + fVar62 * fStack_314;
  auVar46._8_4_ =
       fVar54 * fStack_3e0 + fVar71 * fStack_240 + fVar53 * fStack_3a0 + fVar63 * fStack_310;
  auVar46._12_4_ =
       auVar34._12_4_ * fStack_3dc +
       auVar36._12_4_ * fStack_23c + fVar119 * fStack_39c + fVar147 * fStack_30c;
  auVar46._16_4_ =
       fVar76 * fStack_3d8 + fVar148 * fStack_238 + fVar115 * fStack_398 + fVar65 * fStack_308;
  auVar46._20_4_ =
       fVar110 * fStack_3d4 + fVar64 * fStack_234 + fVar117 * fStack_394 + fVar62 * fStack_304;
  auVar46._24_4_ =
       fVar54 * fStack_3d0 + fVar71 * fStack_230 + fVar53 * fStack_390 + fVar63 * fStack_300;
  auVar46._28_4_ = fVar147 + fVar119 + 0.0 + 0.0;
  auVar48 = vblendps_avx(auVar46,ZEXT832(0) << 0x20,1);
  auVar14._4_4_ = auVar48._4_4_ * 0.055555556;
  auVar14._0_4_ = auVar48._0_4_ * 0.055555556;
  auVar14._8_4_ = auVar48._8_4_ * 0.055555556;
  auVar14._12_4_ = auVar48._12_4_ * 0.055555556;
  auVar14._16_4_ = auVar48._16_4_ * 0.055555556;
  auVar14._20_4_ = auVar48._20_4_ * 0.055555556;
  auVar14._24_4_ = auVar48._24_4_ * 0.055555556;
  auVar14._28_4_ = auVar48._28_4_;
  auVar16 = vsubps_avx(auVar92,auVar14);
  auVar48 = vblendps_avx(auVar46,ZEXT832(0) << 0x20,0x80);
  auVar47._0_4_ = auVar92._0_4_ + auVar48._0_4_ * 0.055555556;
  auVar47._4_4_ = auVar92._4_4_ + auVar48._4_4_ * 0.055555556;
  auVar47._8_4_ = auVar92._8_4_ + auVar48._8_4_ * 0.055555556;
  auVar47._12_4_ = auVar92._12_4_ + auVar48._12_4_ * 0.055555556;
  auVar47._16_4_ = auVar92._16_4_ + auVar48._16_4_ * 0.055555556;
  auVar47._20_4_ = auVar92._20_4_ + auVar48._20_4_ * 0.055555556;
  auVar47._24_4_ = auVar92._24_4_ + auVar48._24_4_ * 0.055555556;
  auVar47._28_4_ = auVar48._28_4_ + 0.0;
  auVar48 = vmaxps_avx(auVar16,auVar47);
  auVar59 = vmaxps_avx(auVar59,auVar48);
  auVar36 = vshufps_avx(auVar55,auVar55,0x55);
  auVar34 = vshufps_avx(auVar157,auVar157,0x55);
  fVar76 = auVar36._0_4_;
  fVar54 = auVar36._4_4_;
  fVar117 = auVar36._8_4_;
  fVar119 = auVar36._12_4_;
  fVar110 = auVar34._0_4_;
  fVar115 = auVar34._4_4_;
  fVar53 = auVar34._8_4_;
  fVar65 = auVar34._12_4_;
  auVar36 = vshufps_avx(auVar124,auVar124,0x55);
  fVar62 = auVar36._0_4_;
  fVar63 = auVar36._4_4_;
  fVar147 = auVar36._8_4_;
  auVar34 = vshufps_avx(auVar150,auVar150,0x55);
  fVar148 = auVar34._0_4_;
  fVar64 = auVar34._4_4_;
  fVar71 = auVar34._8_4_;
  fVar73 = auVar34._12_4_;
  auVar145._0_4_ =
       fVar148 * local_3c8 + fVar62 * local_2b8 + local_2f8 * fVar110 + local_2d8 * fVar76;
  auVar145._4_4_ =
       fVar64 * fStack_3c4 + fVar63 * fStack_2b4 + fStack_2f4 * fVar115 + fStack_2d4 * fVar54;
  auVar145._8_4_ =
       fVar71 * fStack_3c0 + fVar147 * fStack_2b0 + fStack_2f0 * fVar53 + fStack_2d0 * fVar117;
  auVar145._12_4_ =
       fVar73 * fStack_3bc +
       auVar36._12_4_ * fStack_2ac + fStack_2ec * fVar65 + fStack_2cc * fVar119;
  auVar145._16_4_ =
       fVar148 * fStack_3b8 + fVar62 * fStack_2a8 + fStack_2e8 * fVar110 + fStack_2c8 * fVar76;
  auVar145._20_4_ =
       fVar64 * fStack_3b4 + fVar63 * fStack_2a4 + fStack_2e4 * fVar115 + fStack_2c4 * fVar54;
  auVar145._24_4_ =
       fVar71 * fStack_3b0 + fVar147 * fStack_2a0 + fStack_2e0 * fVar53 + fStack_2c0 * fVar117;
  auVar145._28_4_ = fStack_2dc + fStack_2bc + 0.0 + 0.0;
  auVar60._0_4_ =
       fVar148 * local_3e8 + fVar62 * local_248 + local_3a8 * fVar76 + fVar110 * local_318;
  auVar60._4_4_ =
       fVar64 * fStack_3e4 + fVar63 * fStack_244 + fStack_3a4 * fVar54 + fVar115 * fStack_314;
  auVar60._8_4_ =
       fVar71 * fStack_3e0 + fVar147 * fStack_240 + fStack_3a0 * fVar117 + fVar53 * fStack_310;
  auVar60._12_4_ =
       fVar73 * fStack_3dc +
       auVar36._12_4_ * fStack_23c + fStack_39c * fVar119 + fVar65 * fStack_30c;
  auVar60._16_4_ =
       fVar148 * fStack_3d8 + fVar62 * fStack_238 + fStack_398 * fVar76 + fVar110 * fStack_308;
  auVar60._20_4_ =
       fVar64 * fStack_3d4 + fVar63 * fStack_234 + fStack_394 * fVar54 + fVar115 * fStack_304;
  auVar60._24_4_ =
       fVar71 * fStack_3d0 + fVar147 * fStack_230 + fStack_390 * fVar117 + fVar53 * fStack_300;
  auVar60._28_4_ = fVar65 + fVar65 + fVar119 + fVar65;
  auVar48 = vblendps_avx(auVar60,ZEXT432(0) << 0x20,1);
  auVar15._4_4_ = auVar48._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar48._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar48._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar48._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar48._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar48._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar48._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar48._28_4_;
  auVar17 = vsubps_avx(auVar145,auVar15);
  auVar48 = vblendps_avx(auVar60,ZEXT432(0) << 0x20,0x80);
  auVar61._0_4_ = auVar145._0_4_ + auVar48._0_4_ * 0.055555556;
  auVar61._4_4_ = auVar145._4_4_ + auVar48._4_4_ * 0.055555556;
  auVar61._8_4_ = auVar145._8_4_ + auVar48._8_4_ * 0.055555556;
  auVar61._12_4_ = auVar145._12_4_ + auVar48._12_4_ * 0.055555556;
  auVar61._16_4_ = auVar145._16_4_ + auVar48._16_4_ * 0.055555556;
  auVar61._20_4_ = auVar145._20_4_ + auVar48._20_4_ * 0.055555556;
  auVar61._24_4_ = auVar145._24_4_ + auVar48._24_4_ * 0.055555556;
  auVar61._28_4_ = auVar145._28_4_ + auVar48._28_4_;
  auVar113._8_4_ = 0xff800000;
  auVar113._0_8_ = 0xff800000ff800000;
  auVar113._12_4_ = 0xff800000;
  auVar113._16_4_ = 0xff800000;
  auVar113._20_4_ = 0xff800000;
  auVar113._24_4_ = 0xff800000;
  auVar113._28_4_ = 0xff800000;
  auVar48 = vmaxps_avx(auVar113,auVar145);
  auVar14 = vmaxps_avx(auVar17,auVar61);
  auVar15 = vmaxps_avx(auVar48,auVar14);
  auVar34 = vpermilps_avx(auVar55,0);
  auVar36 = vshufps_avx(auVar157,auVar157,0);
  fVar117 = auVar34._0_4_;
  fVar53 = auVar34._4_4_;
  fVar119 = auVar34._8_4_;
  fVar65 = auVar34._12_4_;
  fVar62 = auVar36._0_4_;
  fVar63 = auVar36._4_4_;
  fVar147 = auVar36._8_4_;
  fVar148 = auVar36._12_4_;
  auVar36 = vpermilps_avx(auVar124,0);
  fVar64 = auVar36._0_4_;
  fVar71 = auVar36._4_4_;
  fVar72 = auVar36._8_4_;
  auVar34 = vpermilps_avx(auVar150,0);
  fStack_3ac = SUB84(bezier_basis0._500_8_,4);
  fVar76 = auVar34._0_4_;
  fVar110 = auVar34._4_4_;
  fVar54 = auVar34._8_4_;
  fVar115 = auVar34._12_4_;
  auVar131._0_4_ =
       local_3c8 * fVar76 + fVar64 * local_2b8 + fVar117 * local_2d8 + fVar62 * local_2f8;
  auVar131._4_4_ =
       fStack_3c4 * fVar110 + fVar71 * fStack_2b4 + fVar53 * fStack_2d4 + fVar63 * fStack_2f4;
  auVar131._8_4_ =
       fStack_3c0 * fVar54 + fVar72 * fStack_2b0 + fVar119 * fStack_2d0 + fVar147 * fStack_2f0;
  auVar131._12_4_ =
       fStack_3bc * fVar115 +
       auVar36._12_4_ * fStack_2ac + fVar65 * fStack_2cc + fVar148 * fStack_2ec;
  auVar131._16_4_ =
       fStack_3b8 * fVar76 + fVar64 * fStack_2a8 + fVar117 * fStack_2c8 + fVar62 * fStack_2e8;
  auVar131._20_4_ =
       fStack_3b4 * fVar110 + fVar71 * fStack_2a4 + fVar53 * fStack_2c4 + fVar63 * fStack_2e4;
  auVar131._24_4_ =
       fStack_3b0 * fVar54 + fVar72 * fStack_2a0 + fVar119 * fStack_2c0 + fVar147 * fStack_2e0;
  auVar131._28_4_ = fVar73 + fVar73 + auVar14._28_4_ + fVar73;
  auVar93._0_4_ = fVar64 * local_248 + fVar117 * local_3a8 + fVar62 * local_318 + fVar76 * local_3e8
  ;
  auVar93._4_4_ =
       fVar71 * fStack_244 + fVar53 * fStack_3a4 + fVar63 * fStack_314 + fVar110 * fStack_3e4;
  auVar93._8_4_ =
       fVar72 * fStack_240 + fVar119 * fStack_3a0 + fVar147 * fStack_310 + fVar54 * fStack_3e0;
  auVar93._12_4_ =
       auVar36._12_4_ * fStack_23c + fVar65 * fStack_39c + fVar148 * fStack_30c +
       fVar115 * fStack_3dc;
  auVar93._16_4_ =
       fVar64 * fStack_238 + fVar117 * fStack_398 + fVar62 * fStack_308 + fVar76 * fStack_3d8;
  auVar93._20_4_ =
       fVar71 * fStack_234 + fVar53 * fStack_394 + fVar63 * fStack_304 + fVar110 * fStack_3d4;
  auVar93._24_4_ =
       fVar72 * fStack_230 + fVar119 * fStack_390 + fVar147 * fStack_300 + fVar54 * fStack_3d0;
  auVar93._28_4_ = fVar148 + fVar65 + fVar148 + fVar115;
  auVar48 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,1);
  auVar18._4_4_ = auVar48._4_4_ * 0.055555556;
  auVar18._0_4_ = auVar48._0_4_ * 0.055555556;
  auVar18._8_4_ = auVar48._8_4_ * 0.055555556;
  auVar18._12_4_ = auVar48._12_4_ * 0.055555556;
  auVar18._16_4_ = auVar48._16_4_ * 0.055555556;
  auVar18._20_4_ = auVar48._20_4_ * 0.055555556;
  auVar18._24_4_ = auVar48._24_4_ * 0.055555556;
  auVar18._28_4_ = auVar48._28_4_;
  auVar18 = vsubps_avx(auVar131,auVar18);
  auVar48 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  auVar94._0_4_ = auVar131._0_4_ + auVar48._0_4_ * 0.055555556;
  auVar94._4_4_ = auVar131._4_4_ + auVar48._4_4_ * 0.055555556;
  auVar94._8_4_ = auVar131._8_4_ + auVar48._8_4_ * 0.055555556;
  auVar94._12_4_ = auVar131._12_4_ + auVar48._12_4_ * 0.055555556;
  auVar94._16_4_ = auVar131._16_4_ + auVar48._16_4_ * 0.055555556;
  auVar94._20_4_ = auVar131._20_4_ + auVar48._20_4_ * 0.055555556;
  auVar94._24_4_ = auVar131._24_4_ + auVar48._24_4_ * 0.055555556;
  auVar94._28_4_ = auVar131._28_4_ + auVar48._28_4_;
  auVar48._8_4_ = 0xff800000;
  auVar48._0_8_ = 0xff800000ff800000;
  auVar48._12_4_ = 0xff800000;
  auVar48._16_4_ = 0xff800000;
  auVar48._20_4_ = 0xff800000;
  auVar48._24_4_ = 0xff800000;
  auVar48._28_4_ = 0xff800000;
  auVar48 = vmaxps_avx(auVar48,auVar131);
  auVar14 = vmaxps_avx(auVar18,auVar94);
  local_1a8 = vmaxps_avx(auVar48,auVar14);
  auVar48 = vminps_avx(auVar16,auVar47);
  auVar103._8_4_ = 0x7f800000;
  auVar103._0_8_ = 0x7f8000007f800000;
  auVar103._12_4_ = 0x7f800000;
  auVar103._16_4_ = 0x7f800000;
  auVar103._20_4_ = 0x7f800000;
  auVar103._24_4_ = 0x7f800000;
  auVar103._28_4_ = 0x7f800000;
  auVar14 = vminps_avx(auVar103,auVar92);
  local_1c8 = vminps_avx(auVar14,auVar48);
  auVar48 = vminps_avx(auVar17,auVar61);
  auVar14 = vminps_avx(auVar103,auVar145);
  local_1e8 = vminps_avx(auVar14,auVar48);
  auVar48 = vminps_avx(auVar103,auVar131);
  auVar14 = vminps_avx(auVar18,auVar94);
  local_208 = vminps_avx(auVar48,auVar14);
  auVar68 = vsubps_avx(auVar129,_local_f8);
  auVar36 = vshufps_avx(auVar68,auVar68,0);
  auVar34 = vsubps_avx(auVar10,_local_338);
  auVar44._0_4_ = auVar68._0_4_ + auVar34._0_4_ * 0.33333334;
  auVar44._4_4_ = auVar68._4_4_ + auVar34._4_4_ * 0.33333334;
  auVar44._8_4_ = auVar68._8_4_ + auVar34._8_4_ * 0.33333334;
  auVar44._12_4_ = auVar68._12_4_ + auVar34._12_4_ * 0.33333334;
  auVar34 = vshufps_avx(auVar44,auVar44,0);
  auVar79 = vsubps_avx(auVar156,_local_348);
  auVar11._4_4_ = fVar52;
  auVar11._0_4_ = fVar33;
  auVar11._8_4_ = fVar141;
  auVar11._12_4_ = fVar146;
  auVar55 = vsubps_avx(auVar102,auVar11);
  auVar58._0_4_ = auVar55._0_4_ * 0.33333334;
  auVar58._4_4_ = auVar55._4_4_ * 0.33333334;
  auVar58._8_4_ = auVar55._8_4_ * 0.33333334;
  auVar58._12_4_ = auVar55._12_4_ * 0.33333334;
  auVar102 = vsubps_avx(auVar79,auVar58);
  auVar55 = vshufps_avx(auVar102,auVar102,0);
  fVar141 = auVar55._0_4_;
  fVar146 = auVar55._4_4_;
  fVar147 = auVar55._8_4_;
  fVar148 = auVar55._12_4_;
  auVar55 = vshufps_avx(auVar79,auVar79,0);
  fVar76 = auVar55._0_4_;
  fVar115 = auVar55._4_4_;
  fVar119 = auVar55._8_4_;
  fVar33 = auVar55._12_4_;
  fStack_29c = SUB84(bezier_basis0._1656_8_,4);
  fVar110 = auVar34._0_4_;
  fVar117 = auVar34._4_4_;
  fVar65 = auVar34._8_4_;
  fVar52 = auVar34._12_4_;
  fVar54 = auVar36._0_4_;
  fVar53 = auVar36._4_4_;
  fVar62 = auVar36._8_4_;
  fVar63 = auVar36._12_4_;
  auVar151._0_4_ =
       local_3c8 * fVar54 + local_2b8 * fVar110 + fVar141 * local_2d8 + local_2f8 * fVar76;
  auVar151._4_4_ =
       fStack_3c4 * fVar53 + fStack_2b4 * fVar117 + fVar146 * fStack_2d4 + fStack_2f4 * fVar115;
  auVar151._8_4_ =
       fStack_3c0 * fVar62 + fStack_2b0 * fVar65 + fVar147 * fStack_2d0 + fStack_2f0 * fVar119;
  auVar151._12_4_ =
       fStack_3bc * fVar63 + fStack_2ac * fVar52 + fVar148 * fStack_2cc + fStack_2ec * fVar33;
  auVar151._16_4_ =
       fStack_3b8 * fVar54 + fStack_2a8 * fVar110 + fVar141 * fStack_2c8 + fStack_2e8 * fVar76;
  auVar151._20_4_ =
       fStack_3b4 * fVar53 + fStack_2a4 * fVar117 + fVar146 * fStack_2c4 + fStack_2e4 * fVar115;
  auVar151._24_4_ =
       fStack_3b0 * fVar62 + fStack_2a0 * fVar65 + fVar147 * fStack_2c0 + fStack_2e0 * fVar119;
  auVar151._28_4_ = 0x7f800000;
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar49._16_4_ = 0xff800000;
  auVar49._20_4_ = 0xff800000;
  auVar49._24_4_ = 0xff800000;
  auVar49._28_4_ = 0xff800000;
  auVar14 = vmaxps_avx(auVar49,auVar151);
  auVar69._0_4_ =
       local_3e8 * fVar54 + local_248 * fVar110 + fVar141 * local_3a8 + fVar76 * local_318;
  auVar69._4_4_ =
       fStack_3e4 * fVar53 + fStack_244 * fVar117 + fVar146 * fStack_3a4 + fVar115 * fStack_314;
  auVar69._8_4_ =
       fStack_3e0 * fVar62 + fStack_240 * fVar65 + fVar147 * fStack_3a0 + fVar119 * fStack_310;
  auVar69._12_4_ =
       fStack_3dc * fVar63 + fStack_23c * fVar52 + fVar148 * fStack_39c + fVar33 * fStack_30c;
  auVar69._16_4_ =
       fStack_3d8 * fVar54 + fStack_238 * fVar110 + fVar141 * fStack_398 + fVar76 * fStack_308;
  auVar69._20_4_ =
       fStack_3d4 * fVar53 + fStack_234 * fVar117 + fVar146 * fStack_394 + fVar115 * fStack_304;
  auVar69._24_4_ =
       fStack_3d0 * fVar62 + fStack_230 * fVar65 + fVar147 * fStack_390 + fVar119 * fStack_300;
  auVar69._28_4_ = fVar63 + fVar52 + fVar148 + fVar33;
  auVar48 = vblendps_avx(auVar69,ZEXT832(0) << 0x20,1);
  auVar16._4_4_ = auVar48._4_4_ * 0.055555556;
  auVar16._0_4_ = auVar48._0_4_ * 0.055555556;
  auVar16._8_4_ = auVar48._8_4_ * 0.055555556;
  auVar16._12_4_ = auVar48._12_4_ * 0.055555556;
  auVar16._16_4_ = auVar48._16_4_ * 0.055555556;
  auVar16._20_4_ = auVar48._20_4_ * 0.055555556;
  auVar16._24_4_ = auVar48._24_4_ * 0.055555556;
  auVar16._28_4_ = auVar48._28_4_;
  auVar16 = vsubps_avx(auVar151,auVar16);
  auVar48 = vblendps_avx(auVar69,ZEXT832(0) << 0x20,0x80);
  local_268._0_4_ = auVar151._0_4_ + auVar48._0_4_ * 0.055555556;
  local_268._4_4_ = auVar151._4_4_ + auVar48._4_4_ * 0.055555556;
  local_268._8_4_ = auVar151._8_4_ + auVar48._8_4_ * 0.055555556;
  local_268._12_4_ = auVar151._12_4_ + auVar48._12_4_ * 0.055555556;
  local_268._16_4_ = auVar151._16_4_ + auVar48._16_4_ * 0.055555556;
  local_268._20_4_ = auVar151._20_4_ + auVar48._20_4_ * 0.055555556;
  local_268._24_4_ = auVar151._24_4_ + auVar48._24_4_ * 0.055555556;
  local_268._28_4_ = auVar48._28_4_ + INFINITY;
  auVar48 = vmaxps_avx(auVar16,local_268);
  auVar48 = vmaxps_avx(auVar14,auVar48);
  auVar14 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar36 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar34 = vshufps_avx(auVar102,auVar102,0x55);
  auVar55 = vshufps_avx(auVar79,auVar79,0x55);
  fVar76 = auVar34._0_4_;
  fVar110 = auVar34._4_4_;
  fVar54 = auVar34._8_4_;
  fVar115 = auVar34._12_4_;
  fVar117 = auVar55._0_4_;
  fVar53 = auVar55._4_4_;
  fVar119 = auVar55._8_4_;
  fVar65 = auVar55._12_4_;
  auVar34 = vshufps_avx(auVar44,auVar44,0x55);
  fVar63 = auVar34._0_4_;
  fVar141 = auVar34._4_4_;
  fVar146 = auVar34._8_4_;
  auVar55 = vshufps_avx(auVar68,auVar68,0x55);
  fVar62 = auVar55._0_4_;
  fVar33 = auVar55._4_4_;
  fVar52 = auVar55._8_4_;
  fVar148 = auVar55._12_4_;
  auVar97._0_4_ = fVar62 * local_3c8 + fVar63 * local_2b8 + fVar117 * local_2f8 + fVar76 * local_2d8
  ;
  auVar97._4_4_ =
       fVar33 * fStack_3c4 + fVar141 * fStack_2b4 + fVar53 * fStack_2f4 + fVar110 * fStack_2d4;
  auVar97._8_4_ =
       fVar52 * fStack_3c0 + fVar146 * fStack_2b0 + fVar119 * fStack_2f0 + fVar54 * fStack_2d0;
  auVar97._12_4_ =
       fVar148 * fStack_3bc +
       auVar34._12_4_ * fStack_2ac + fVar65 * fStack_2ec + fVar115 * fStack_2cc;
  auVar97._16_4_ =
       fVar62 * fStack_3b8 + fVar63 * fStack_2a8 + fVar117 * fStack_2e8 + fVar76 * fStack_2c8;
  auVar97._20_4_ =
       fVar33 * fStack_3b4 + fVar141 * fStack_2a4 + fVar53 * fStack_2e4 + fVar110 * fStack_2c4;
  auVar97._24_4_ =
       fVar52 * fStack_3b0 + fVar146 * fStack_2a0 + fVar119 * fStack_2e0 + fVar54 * fStack_2c0;
  auVar97._28_4_ = fStack_29c + fStack_2dc + fStack_3ac + 0.0;
  auVar104._0_4_ =
       fVar62 * local_3e8 + fVar63 * local_248 + fVar117 * local_318 + fVar76 * local_3a8;
  auVar104._4_4_ =
       fVar33 * fStack_3e4 + fVar141 * fStack_244 + fVar53 * fStack_314 + fVar110 * fStack_3a4;
  auVar104._8_4_ =
       fVar52 * fStack_3e0 + fVar146 * fStack_240 + fVar119 * fStack_310 + fVar54 * fStack_3a0;
  auVar104._12_4_ =
       fVar148 * fStack_3dc +
       auVar34._12_4_ * fStack_23c + fVar65 * fStack_30c + fVar115 * fStack_39c;
  auVar104._16_4_ =
       fVar62 * fStack_3d8 + fVar63 * fStack_238 + fVar117 * fStack_308 + fVar76 * fStack_398;
  auVar104._20_4_ =
       fVar33 * fStack_3d4 + fVar141 * fStack_234 + fVar53 * fStack_304 + fVar110 * fStack_394;
  auVar104._24_4_ =
       fVar52 * fStack_3d0 + fVar146 * fStack_230 + fVar119 * fStack_300 + fVar54 * fStack_390;
  auVar104._28_4_ = fVar65 + fVar65 + fVar65 + fVar115;
  auVar48 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,1);
  auVar17._4_4_ = auVar48._4_4_ * 0.055555556;
  auVar17._0_4_ = auVar48._0_4_ * 0.055555556;
  auVar17._8_4_ = auVar48._8_4_ * 0.055555556;
  auVar17._12_4_ = auVar48._12_4_ * 0.055555556;
  auVar17._16_4_ = auVar48._16_4_ * 0.055555556;
  auVar17._20_4_ = auVar48._20_4_ * 0.055555556;
  auVar17._24_4_ = auVar48._24_4_ * 0.055555556;
  auVar17._28_4_ = auVar48._28_4_;
  auVar17 = vsubps_avx(auVar97,auVar17);
  auVar48 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  auVar158._0_4_ = auVar97._0_4_ + auVar48._0_4_ * 0.055555556;
  auVar158._4_4_ = auVar97._4_4_ + auVar48._4_4_ * 0.055555556;
  auVar158._8_4_ = auVar97._8_4_ + auVar48._8_4_ * 0.055555556;
  auVar158._12_4_ = auVar97._12_4_ + auVar48._12_4_ * 0.055555556;
  auVar158._16_4_ = auVar97._16_4_ + auVar48._16_4_ * 0.055555556;
  auVar158._20_4_ = auVar97._20_4_ + auVar48._20_4_ * 0.055555556;
  auVar158._24_4_ = auVar97._24_4_ + auVar48._24_4_ * 0.055555556;
  auVar158._28_4_ = auVar97._28_4_ + auVar48._28_4_;
  auVar105._8_4_ = 0xff800000;
  auVar105._0_8_ = 0xff800000ff800000;
  auVar105._12_4_ = 0xff800000;
  auVar105._16_4_ = 0xff800000;
  auVar105._20_4_ = 0xff800000;
  auVar105._24_4_ = 0xff800000;
  auVar105._28_4_ = 0xff800000;
  auVar48 = vmaxps_avx(auVar105,auVar97);
  auVar14 = vmaxps_avx(auVar17,auVar158);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar14 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar34 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar55 = vunpcklps_avx(auVar36,auVar34);
  auVar36 = vshufps_avx(auVar102,auVar102,0xaa);
  auVar34 = vshufps_avx(auVar79,auVar79,0xaa);
  fVar62 = auVar36._0_4_;
  fVar33 = auVar36._4_4_;
  fVar52 = auVar36._8_4_;
  fVar63 = auVar36._12_4_;
  fVar76 = auVar34._0_4_;
  fVar110 = auVar34._4_4_;
  fVar54 = auVar34._8_4_;
  fVar115 = auVar34._12_4_;
  auVar36 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar117 = auVar36._0_4_;
  fVar53 = auVar36._4_4_;
  fVar119 = auVar36._8_4_;
  fVar65 = auVar36._12_4_;
  auVar36 = vshufps_avx(auVar68,auVar68,0xaa);
  fVar141 = auVar36._0_4_;
  fVar146 = auVar36._4_4_;
  fVar147 = auVar36._8_4_;
  auVar70._0_4_ =
       fVar141 * local_3c8 + fVar117 * local_2b8 + fVar76 * local_2f8 + fVar62 * local_2d8;
  auVar70._4_4_ =
       fVar146 * fStack_3c4 + fVar53 * fStack_2b4 + fVar110 * fStack_2f4 + fVar33 * fStack_2d4;
  auVar70._8_4_ =
       fVar147 * fStack_3c0 + fVar119 * fStack_2b0 + fVar54 * fStack_2f0 + fVar52 * fStack_2d0;
  auVar70._12_4_ =
       auVar36._12_4_ * fStack_3bc +
       fVar65 * fStack_2ac + fVar115 * fStack_2ec + fVar63 * fStack_2cc;
  auVar70._16_4_ =
       fVar141 * fStack_3b8 + fVar117 * fStack_2a8 + fVar76 * fStack_2e8 + fVar62 * fStack_2c8;
  auVar70._20_4_ =
       fVar146 * fStack_3b4 + fVar53 * fStack_2a4 + fVar110 * fStack_2e4 + fVar33 * fStack_2c4;
  auVar70._24_4_ =
       fVar147 * fStack_3b0 + fVar119 * fStack_2a0 + fVar54 * fStack_2e0 + fVar52 * fStack_2c0;
  auVar70._28_4_ = fVar148 + fVar148 + fVar148 + 0.0;
  auVar132._0_4_ =
       fVar141 * local_3e8 + fVar117 * local_248 + fVar62 * local_3a8 + fVar76 * local_318;
  auVar132._4_4_ =
       fVar146 * fStack_3e4 + fVar53 * fStack_244 + fVar33 * fStack_3a4 + fVar110 * fStack_314;
  auVar132._8_4_ =
       fVar147 * fStack_3e0 + fVar119 * fStack_240 + fVar52 * fStack_3a0 + fVar54 * fStack_310;
  auVar132._12_4_ =
       auVar36._12_4_ * fStack_3dc +
       fVar65 * fStack_23c + fVar63 * fStack_39c + fVar115 * fStack_30c;
  auVar132._16_4_ =
       fVar141 * fStack_3d8 + fVar117 * fStack_238 + fVar62 * fStack_398 + fVar76 * fStack_308;
  auVar132._20_4_ =
       fVar146 * fStack_3d4 + fVar53 * fStack_234 + fVar33 * fStack_394 + fVar110 * fStack_304;
  auVar132._24_4_ =
       fVar147 * fStack_3d0 + fVar119 * fStack_230 + fVar52 * fStack_390 + fVar54 * fStack_300;
  auVar132._28_4_ = fVar65 + fVar65 + fVar63 + fVar115;
  auVar48 = vblendps_avx(auVar132,ZEXT832(0) << 0x20,1);
  auVar19._4_4_ = auVar48._4_4_ * 0.055555556;
  auVar19._0_4_ = auVar48._0_4_ * 0.055555556;
  auVar19._8_4_ = auVar48._8_4_ * 0.055555556;
  auVar19._12_4_ = auVar48._12_4_ * 0.055555556;
  auVar19._16_4_ = auVar48._16_4_ * 0.055555556;
  auVar19._20_4_ = auVar48._20_4_ * 0.055555556;
  auVar19._24_4_ = auVar48._24_4_ * 0.055555556;
  auVar19._28_4_ = auVar48._28_4_;
  auVar18 = vsubps_avx(auVar70,auVar19);
  auVar48 = vblendps_avx(auVar132,ZEXT832(0) << 0x20,0x80);
  auVar133._0_4_ = auVar48._0_4_ * 0.055555556 + auVar70._0_4_;
  auVar133._4_4_ = auVar48._4_4_ * 0.055555556 + auVar70._4_4_;
  auVar133._8_4_ = auVar48._8_4_ * 0.055555556 + auVar70._8_4_;
  auVar133._12_4_ = auVar48._12_4_ * 0.055555556 + auVar70._12_4_;
  auVar133._16_4_ = auVar48._16_4_ * 0.055555556 + auVar70._16_4_;
  auVar133._20_4_ = auVar48._20_4_ * 0.055555556 + auVar70._20_4_;
  auVar133._24_4_ = auVar48._24_4_ * 0.055555556 + auVar70._24_4_;
  auVar133._28_4_ = auVar48._28_4_ + auVar70._28_4_;
  auVar50._8_4_ = 0xff800000;
  auVar50._0_8_ = 0xff800000ff800000;
  auVar50._12_4_ = 0xff800000;
  auVar50._16_4_ = 0xff800000;
  auVar50._20_4_ = 0xff800000;
  auVar50._24_4_ = 0xff800000;
  auVar50._28_4_ = 0xff800000;
  auVar48 = vmaxps_avx(auVar50,auVar70);
  auVar14 = vmaxps_avx(auVar18,auVar133);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar14 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar36 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar36 = vinsertps_avx(auVar55,auVar36,0x28);
  auVar135._8_4_ = 0x5dccb9a2;
  auVar135._0_8_ = 0x5dccb9a25dccb9a2;
  auVar135._12_4_ = 0x5dccb9a2;
  auVar136 = ZEXT1664(auVar135);
  auVar48 = vminps_avx(auVar16,local_268);
  auVar51._8_4_ = 0x7f800000;
  auVar51._0_8_ = 0x7f8000007f800000;
  auVar51._12_4_ = 0x7f800000;
  auVar51._16_4_ = 0x7f800000;
  auVar51._20_4_ = 0x7f800000;
  auVar51._24_4_ = 0x7f800000;
  auVar51._28_4_ = 0x7f800000;
  auVar14 = vminps_avx(auVar51,auVar151);
  auVar48 = vminps_avx(auVar14,auVar48);
  auVar14 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar34 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar48 = vminps_avx(auVar17,auVar158);
  auVar14 = vminps_avx(auVar51,auVar97);
  auVar48 = vminps_avx(auVar14,auVar48);
  auVar14 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar55 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar55 = vunpcklps_avx(auVar34,auVar55);
  auVar48 = vminps_avx(auVar18,auVar133);
  auVar125._8_4_ = 0xddccb9a2;
  auVar125._0_8_ = 0xddccb9a2ddccb9a2;
  auVar125._12_4_ = 0xddccb9a2;
  auVar126 = ZEXT1664(auVar125);
  auVar14 = vminps_avx(auVar51,auVar70);
  auVar48 = vminps_avx(auVar14,auVar48);
  auVar14 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar34 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar34 = vinsertps_avx(auVar55,auVar34,0x28);
  auVar48 = vshufps_avx(local_208,local_208,0xb1);
  auVar48 = vminps_avx(local_208,auVar48);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar55 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar48 = vshufps_avx(local_1e8,local_1e8,0xb1);
  auVar48 = vminps_avx(local_1e8,auVar48);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar68 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar68 = vunpcklps_avx(auVar55,auVar68);
  auVar48 = vshufps_avx(local_1c8,local_1c8,0xb1);
  auVar48 = vminps_avx(local_1c8,auVar48);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vminps_avx(auVar48,auVar14);
  auVar55 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar55 = vinsertps_avx(auVar68,auVar55,0x28);
  auVar68 = vminps_avx(auVar34,auVar55);
  auVar48 = vshufps_avx(local_1a8,local_1a8,0xb1);
  auVar48 = vmaxps_avx(local_1a8,auVar48);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar34 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar48 = vshufps_avx(auVar15,auVar15,0xb1);
  auVar48 = vmaxps_avx(auVar15,auVar48);
  auVar14 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vmaxps_avx(auVar48,auVar14);
  auVar55 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar55 = vunpcklps_avx(auVar34,auVar55);
  auVar48 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar48 = vmaxps_avx(auVar59,auVar48);
  auVar59 = vshufpd_avx(auVar48,auVar48,5);
  auVar48 = vmaxps_avx(auVar48,auVar59);
  auVar34 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
  auVar34 = vinsertps_avx(auVar55,auVar34,0x28);
  auVar34 = vmaxps_avx(auVar36,auVar34);
  auVar36 = vcmpps_avx(auVar68,auVar125,6);
  auVar34 = vcmpps_avx(auVar34,auVar135,1);
  auVar36 = vandps_avx(auVar34,auVar36);
  uVar28 = vmovmskps_avx(auVar36);
  lVar30 = lVar30 + 0x38;
  if ((~(byte)uVar28 & 7) != 0) goto LAB_00bd3d86;
  goto LAB_00bd2ffe;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }